

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleMenuFile(void)

{
  bool bVar1;
  ImU32 col;
  ImDrawList *this;
  float _x;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 p;
  char *name;
  int i_1;
  float sz;
  int i;
  
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
               ,0x1917,"Examples/Menu",GImGuiDemoMarkerCallbackUserData);
  }
  ImGui::MenuItem("(demo menu)",(char *)0x0,false,false);
  ImGui::MenuItem("New",(char *)0x0,false,true);
  ImGui::MenuItem("Open","Ctrl+O",false,true);
  bVar1 = ImGui::BeginMenu("Open Recent",true);
  if (bVar1) {
    ImGui::MenuItem("fish_hat.c",(char *)0x0,false,true);
    ImGui::MenuItem("fish_hat.inl",(char *)0x0,false,true);
    ImGui::MenuItem("fish_hat.h",(char *)0x0,false,true);
    bVar1 = ImGui::BeginMenu("More..",true);
    if (bVar1) {
      ImGui::MenuItem("Hello",(char *)0x0,false,true);
      ImGui::MenuItem("Sailor",(char *)0x0,false,true);
      bVar1 = ImGui::BeginMenu("Recurse..",true);
      if (bVar1) {
        ShowExampleMenuFile();
        ImGui::EndMenu();
      }
      ImGui::EndMenu();
    }
    ImGui::EndMenu();
  }
  ImGui::MenuItem("Save","Ctrl+S",false,true);
  ImGui::MenuItem("Save As..",(char *)0x0,false,true);
  ImGui::Separator();
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
               ,0x1931,"Examples/Menu/Options",GImGuiDemoMarkerCallbackUserData);
  }
  bVar1 = ImGui::BeginMenu("Options",true);
  if (bVar1) {
    ImGui::MenuItem("Enabled","",&ShowExampleMenuFile::enabled,true);
    ImVec2::ImVec2((ImVec2 *)&sz,0.0,60.0);
    ImGui::BeginChild("child",(ImVec2 *)&sz,true,0);
    for (i_1 = 0; i_1 < 10; i_1 = i_1 + 1) {
      ImGui::Text("Scrolling Text %d",(ulong)(uint)i_1);
    }
    ImGui::EndChild();
    ImGui::SliderFloat("Value",&ShowExampleMenuFile::f,0.0,1.0,"%.3f",0);
    ImGui::InputFloat("Input",&ShowExampleMenuFile::f,0.1,0.0,"%.3f",0);
    ImGui::Combo("Combo",&ShowExampleMenuFile::n,"Yes",-1);
    ImGui::EndMenu();
  }
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
               ,0x1942,"Examples/Menu/Colors",GImGuiDemoMarkerCallbackUserData);
  }
  bVar1 = ImGui::BeginMenu("Colors",true);
  if (bVar1) {
    _x = ImGui::GetTextLineHeight();
    for (name._4_4_ = 0; name._4_4_ < 0x35; name._4_4_ = name._4_4_ + 1) {
      p = (ImVec2)ImGui::GetStyleColorName(name._4_4_);
      local_30 = ImGui::GetCursorScreenPos();
      this = ImGui::GetWindowDrawList();
      ImVec2::ImVec2(&local_38,local_30.x + _x,local_30.y + _x);
      col = ImGui::GetColorU32(name._4_4_,1.0);
      ImDrawList::AddRectFilled(this,&local_30,&local_38,col,0.0,0);
      ImVec2::ImVec2(&local_40,_x,_x);
      ImGui::Dummy(&local_40);
      ImGui::SameLine(0.0,-1.0);
      ImGui::MenuItem((char *)p,(char *)0x0,false,true);
    }
    ImGui::EndMenu();
  }
  bVar1 = ImGui::BeginMenu("Options",true);
  if (bVar1) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
                 ,0x1957,"Examples/Menu/Append to an existing menu",GImGuiDemoMarkerCallbackUserData
                );
    }
    ImGui::Checkbox("SomeOption",&ShowExampleMenuFile::b);
    ImGui::EndMenu();
  }
  bVar1 = ImGui::BeginMenu("Disabled",false);
  if (!bVar1) {
    ImGui::MenuItem("Checked",(char *)0x0,true,true);
    ImGui::MenuItem("Quit","Alt+F4",false,true);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
                ,0x195f,"void ShowExampleMenuFile()");
}

Assistant:

static void ShowExampleMenuFile()
{
    IMGUI_DEMO_MARKER("Examples/Menu");
    ImGui::MenuItem("(demo menu)", NULL, false, false);
    if (ImGui::MenuItem("New")) {}
    if (ImGui::MenuItem("Open", "Ctrl+O")) {}
    if (ImGui::BeginMenu("Open Recent"))
    {
        ImGui::MenuItem("fish_hat.c");
        ImGui::MenuItem("fish_hat.inl");
        ImGui::MenuItem("fish_hat.h");
        if (ImGui::BeginMenu("More.."))
        {
            ImGui::MenuItem("Hello");
            ImGui::MenuItem("Sailor");
            if (ImGui::BeginMenu("Recurse.."))
            {
                ShowExampleMenuFile();
                ImGui::EndMenu();
            }
            ImGui::EndMenu();
        }
        ImGui::EndMenu();
    }
    if (ImGui::MenuItem("Save", "Ctrl+S")) {}
    if (ImGui::MenuItem("Save As..")) {}

    ImGui::Separator();
    IMGUI_DEMO_MARKER("Examples/Menu/Options");
    if (ImGui::BeginMenu("Options"))
    {
        static bool enabled = true;
        ImGui::MenuItem("Enabled", "", &enabled);
        ImGui::BeginChild("child", ImVec2(0, 60), true);
        for (int i = 0; i < 10; i++)
            ImGui::Text("Scrolling Text %d", i);
        ImGui::EndChild();
        static float f = 0.5f;
        static int n = 0;
        ImGui::SliderFloat("Value", &f, 0.0f, 1.0f);
        ImGui::InputFloat("Input", &f, 0.1f);
        ImGui::Combo("Combo", &n, "Yes\0No\0Maybe\0\0");
        ImGui::EndMenu();
    }

    IMGUI_DEMO_MARKER("Examples/Menu/Colors");
    if (ImGui::BeginMenu("Colors"))
    {
        float sz = ImGui::GetTextLineHeight();
        for (int i = 0; i < ImGuiCol_COUNT; i++)
        {
            const char* name = ImGui::GetStyleColorName((ImGuiCol)i);
            ImVec2 p = ImGui::GetCursorScreenPos();
            ImGui::GetWindowDrawList()->AddRectFilled(p, ImVec2(p.x + sz, p.y + sz), ImGui::GetColorU32((ImGuiCol)i));
            ImGui::Dummy(ImVec2(sz, sz));
            ImGui::SameLine();
            ImGui::MenuItem(name);
        }
        ImGui::EndMenu();
    }

    // Here we demonstrate appending again to the "Options" menu (which we already created above)
    // Of course in this demo it is a little bit silly that this function calls BeginMenu("Options") twice.
    // In a real code-base using it would make senses to use this feature from very different code locations.
    if (ImGui::BeginMenu("Options")) // <-- Append!
    {
        IMGUI_DEMO_MARKER("Examples/Menu/Append to an existing menu");
        static bool b = true;
        ImGui::Checkbox("SomeOption", &b);
        ImGui::EndMenu();
    }

    if (ImGui::BeginMenu("Disabled", false)) // Disabled
    {
        IM_ASSERT(0);
    }
    if (ImGui::MenuItem("Checked", NULL, true)) {}
    if (ImGui::MenuItem("Quit", "Alt+F4")) {}
}